

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

void bitset_container_offset
               (bitset_container_t *c,container_t **loc,container_t **hic,uint16_t offset)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  ulong uVar3;
  int iVar4;
  bitset_container_t *bitset;
  sbyte sVar5;
  undefined6 in_register_0000000a;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  short sVar10;
  uint uVar11;
  uint uVar12;
  
  uVar3 = CONCAT62(in_register_0000000a,offset) >> 6;
  uVar6 = (uint)uVar3;
  uVar11 = (uint)CONCAT62(in_register_0000000a,offset) & 0x3f;
  uVar12 = 0x400 - (uVar6 & 0x3ffffff);
  sVar10 = (short)uVar11;
  sVar5 = (sbyte)uVar11;
  if (loc == (container_t **)0x0) {
    bitset = (bitset_container_t *)0x0;
  }
  else {
    bitset = bitset_container_create();
    if (sVar10 == 0) {
      memcpy((void *)((ulong)((uVar6 & 0xffff) << 3) + (long)bitset->words),c->words,
             (ulong)((uVar12 & 0xffff) << 3));
    }
    else {
      puVar1 = c->words;
      puVar2 = bitset->words;
      uVar7 = uVar3 & 0xffff;
      puVar2[uVar7] = *puVar1 << sVar5;
      if ((int)uVar7 != 0x3ff) {
        uVar11 = 2;
        if (2 < (ushort)uVar12) {
          uVar11 = uVar12;
        }
        uVar8 = 1;
        do {
          puVar2[uVar7 + uVar8] =
               puVar1[uVar8 - 1] >> (0x40U - sVar5 & 0x3f) | puVar1[uVar8] << sVar5;
          uVar8 = uVar8 + 1;
        } while ((uVar11 & 0xffff) != uVar8);
      }
    }
    iVar4 = bitset_container_compute_cardinality(bitset);
    bitset->cardinality = iVar4;
    if (iVar4 != 0) {
      *loc = bitset;
    }
    if (iVar4 == c->cardinality) {
      return;
    }
  }
  if (hic == (container_t **)0x0) {
    if (bitset->cardinality == 0) goto LAB_0010c021;
  }
  else {
    if ((bitset == (bitset_container_t *)0x0) || (bitset->cardinality != 0)) {
      bitset = bitset_container_create();
    }
    if (sVar10 == 0) {
      memcpy(bitset->words,(void *)((ulong)((uVar12 & 0xffff) << 3) + (long)c->words),
             (ulong)((uVar6 & 0xffff) << 3));
    }
    else {
      if (0x3f < offset) {
        puVar1 = bitset->words;
        uVar6 = (uVar12 & 0xffff) << 3;
        puVar2 = c->words;
        lVar9 = 0;
        do {
          puVar1[lVar9] =
               *(ulong *)((long)puVar2 + lVar9 * 8 + ((ulong)uVar6 - 8)) >> (0x40U - sVar5 & 0x3f) |
               *(long *)((long)puVar2 + lVar9 * 8 + (ulong)uVar6) << sVar5;
          lVar9 = lVar9 + 1;
        } while (0x400 - (ulong)(uVar12 & 0xffff) != lVar9);
      }
      bitset->words[uVar3 & 0xffff] = c->words[0x3ff] >> (-sVar5 & 0x3fU);
    }
    iVar4 = bitset_container_compute_cardinality(bitset);
    bitset->cardinality = iVar4;
    if (iVar4 == 0) {
LAB_0010c021:
      bitset_container_free(bitset);
      return;
    }
    *hic = bitset;
  }
  return;
}

Assistant:

void bitset_container_offset(const bitset_container_t *c, container_t **loc,
                             container_t **hic, uint16_t offset) {
    bitset_container_t *bc = NULL;
    uint64_t val;
    uint16_t b, i, end;

    b = offset >> 6;
    i = offset % 64;
    end = 1024 - b;

    if (loc != NULL) {
        bc = bitset_container_create();
        if (i == 0) {
            memcpy(bc->words + b, c->words, 8 * end);
        } else {
            bc->words[b] = c->words[0] << i;
            for (uint32_t k = 1; k < end; ++k) {
                val = c->words[k] << i;
                val |= c->words[k - 1] >> (64 - i);
                bc->words[b + k] = val;
            }
        }

        bc->cardinality = bitset_container_compute_cardinality(bc);
        if (bc->cardinality != 0) {
            *loc = bc;
        }
        if (bc->cardinality == c->cardinality) {
            return;
        }
    }

    if (hic == NULL) {
        // Both hic and loc can't be NULL, so bc is never NULL here
        if (bc->cardinality == 0) {
            bitset_container_free(bc);
        }
        return;
    }

    if (bc == NULL || bc->cardinality != 0) {
        bc = bitset_container_create();
    }

    if (i == 0) {
        memcpy(bc->words, c->words + end, 8 * b);
    } else {
        for (uint32_t k = end; k < 1024; ++k) {
            val = c->words[k] << i;
            val |= c->words[k - 1] >> (64 - i);
            bc->words[k - end] = val;
        }
        bc->words[b] = c->words[1023] >> (64 - i);
    }

    bc->cardinality = bitset_container_compute_cardinality(bc);
    if (bc->cardinality == 0) {
        bitset_container_free(bc);
        return;
    }
    *hic = bc;
}